

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void initialize_crc32(void)

{
  enet_uint32 eVar1;
  int local_14;
  uint local_10;
  int offset;
  enet_uint32 crc;
  int byte;
  
  for (offset = 0; offset < 0x100; offset = offset + 1) {
    eVar1 = reflect_crc(offset,8);
    local_10 = eVar1 << 0x18;
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      if ((local_10 & 0x80000000) == 0) {
        local_10 = local_10 << 1;
      }
      else {
        local_10 = local_10 << 1 ^ 0x4c11db7;
      }
    }
    eVar1 = reflect_crc(local_10,0x20);
    crcTable[offset] = eVar1;
  }
  initializedCRC32 = 1;
  return;
}

Assistant:

static void initialize_crc32(void) {
        int byte;

        for (byte = 0; byte < 256; ++byte) {
            enet_uint32 crc = reflect_crc(byte, 8) << 24;
            int offset;

            for (offset = 0; offset < 8; ++offset) {
                if (crc & 0x80000000) {
                    crc = (crc << 1) ^ 0x04c11db7;
                } else {
                    crc <<= 1;
                }
            }

            crcTable[byte] = reflect_crc(crc, 32);
        }

        initializedCRC32 = 1;
    }